

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::
emplaceRealloc<slang::ast::EvalContext::Frame>
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,pointer pos,Frame *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pFVar3;
  Frame *__result;
  Frame *this_00;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Frame *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::EvalContext::Frame> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pFVar3 = begin(this);
  __result = (Frame *)slang::detail::allocArray(capacity,0x50);
  this_00 = __result + ((long)pos - (long)pFVar3) / 0x50;
  ast::EvalContext::Frame::Frame(this_00,args);
  pFVar3 = end(this);
  if (pos == pFVar3) {
    __first = begin(this);
    pFVar3 = end(this);
    std::uninitialized_move<slang::ast::EvalContext::Frame*,slang::ast::EvalContext::Frame*>
              (__first,pFVar3,__result);
  }
  else {
    pFVar3 = begin(this);
    std::uninitialized_move<slang::ast::EvalContext::Frame*,slang::ast::EvalContext::Frame*>
              (pFVar3,pos,__result);
    pFVar3 = end(this);
    std::uninitialized_move<slang::ast::EvalContext::Frame*,slang::ast::EvalContext::Frame*>
              (pos,pFVar3,this_00 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pFVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}